

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void aead_do_encrypt_init(ptls_aead_context_t *_ctx,uint64_t seq,void *aad,size_t aadlen)

{
  int local_60;
  int local_5c;
  int blocklen;
  int ret;
  uint8_t iv [32];
  aead_crypto_context_t *ctx;
  size_t aadlen_local;
  void *aad_local;
  uint64_t seq_local;
  ptls_aead_context_t *_ctx_local;
  
  ptls_aead__build_iv(_ctx->algo,(uint8_t *)&blocklen,(uint8_t *)&_ctx[1].dispose_crypto,seq);
  local_5c = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                                (uchar *)0x0,(uchar *)&blocklen);
  if (local_5c == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                  0x51d,
                  "void aead_do_encrypt_init(ptls_aead_context_t *, uint64_t, const void *, size_t)"
                 );
  }
  if ((aadlen != 0) &&
     (local_5c = EVP_EncryptUpdate((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)0x0,&local_60,
                                   (uchar *)aad,(int)aadlen), local_5c == 0)) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                  0x522,
                  "void aead_do_encrypt_init(ptls_aead_context_t *, uint64_t, const void *, size_t)"
                 );
  }
  return;
}

Assistant:

static void aead_do_encrypt_init(ptls_aead_context_t *_ctx, uint64_t seq, const void *aad, size_t aadlen)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t iv[PTLS_MAX_IV_SIZE];
    int ret;

    ptls_aead__build_iv(ctx->super.algo, iv, ctx->static_iv, seq);
    ret = EVP_EncryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv);
    assert(ret);

    if (aadlen != 0) {
        int blocklen;
        ret = EVP_EncryptUpdate(ctx->evp_ctx, NULL, &blocklen, aad, (int)aadlen);
        assert(ret);
    }
}